

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_mesh.cpp
# Opt level: O1

bool __thiscall
ON_SubD::Internal_GetGeometryControlNetMesh
          (ON_SubD *this,ON_SubDLevel *level,ON_SubDLevelComponentIdIterator *vit_by_id,
          ON_SubDLevelComponentIdIterator *fit_by_id,ON_Mesh *mesh)

{
  void *__base;
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  ON_SubDComponentBase *pOVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  ON_SubDVertex *pOVar14;
  ON_3dPoint *pOVar15;
  bool *pbVar16;
  ON_SubDFace *pOVar17;
  double *subdivision_point;
  ulong uVar18;
  void *pvVar19;
  ON_SubDEdge *this_00;
  undefined4 *puVar20;
  ushort uVar21;
  ON_SubDFace *pOVar22;
  uint uVar23;
  long lVar24;
  uint *puVar25;
  uint uVar26;
  ON_MeshFace *pOVar27;
  ulong uVar28;
  VertexToDuplicate *pVVar29;
  ushort uVar30;
  ulong uVar31;
  VertexToDuplicate *pVVar32;
  int iVar33;
  long lVar34;
  ON_MeshFace meshf;
  ON_SimpleArray<VertexToDuplicate> dups_array;
  VertexToDuplicate dup;
  ON_SimpleArray<ON_2udex> ngon_spans;
  ON_SimpleArray<bool> mesh_VertexNeedsDuplicated;
  ON_2udex ngon_span;
  ON_3dPoint center_point;
  bool local_1a1;
  ON_SimpleArray<ON_3dPoint> *local_1a0;
  VertexToDuplicate local_198;
  uint local_16c;
  ON_SubDLevel *local_168;
  ON_SimpleArray<ON_MeshFace> *local_160;
  long local_158;
  ulong local_150;
  ON_SubDLevelComponentIdIterator *local_148;
  ON_SimpleArray<VertexToDuplicate> local_140;
  VertexToDuplicate local_128;
  ON_SimpleArray<ON_2udex> local_100;
  uint local_e4;
  ON_SimpleArray<bool> local_e0;
  ON_3dPoint local_c8;
  ulong local_a8;
  ulong local_a0;
  ON_SubDSectorIterator local_98;
  uint *local_50;
  uint *local_48;
  VertexToDuplicate *local_40;
  ulong local_38;
  
  local_128.m_sector_id = 0;
  local_128.m_mesh_V_index = 0;
  local_128.m_mesh_F_index = 0;
  local_128.m_vertex = (ON_SubDVertex *)0x0;
  local_128.m_face._0_4_ = 0;
  local_128.m_face._4_4_ = 0;
  local_140._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00829418;
  local_140.m_a = (VertexToDuplicate *)0x0;
  local_140.m_count = 0;
  local_140.m_capacity = 0;
  uVar23 = level->m_vertex_count;
  pOVar17 = level->m_face[0];
  if (pOVar17 == (ON_SubDFace *)0x0) {
    local_150 = 0;
    uVar26 = 0;
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    uVar26 = 0;
    local_150 = 0;
    do {
      uVar21 = pOVar17->m_edge_count;
      if (1 < uVar21) {
        if (uVar21 < 5) {
          uVar26 = uVar26 + 1;
        }
        else {
          uVar12 = uVar12 + 1;
          uVar26 = uVar26 + uVar21;
          if ((uint)local_150 <= (uint)uVar21) {
            local_150 = (ulong)(uint)uVar21;
          }
        }
      }
      pOVar17 = pOVar17->m_next_face;
    } while (pOVar17 != (ON_SubDFace *)0x0);
  }
  local_168 = level;
  local_148 = fit_by_id;
  if ((uVar23 < 3) || (uVar26 == 0)) {
    ON_SubDIncrementErrorCount();
    bVar10 = false;
  }
  else {
    local_1a0 = &ON_Mesh::DoublePrecisionVertices(mesh)->super_ON_SimpleArray<ON_3dPoint>;
    uVar31 = (ulong)(uVar12 + uVar23);
    if ((ulong)(long)local_1a0->m_capacity < uVar31) {
      ON_SimpleArray<ON_3dPoint>::SetCapacity(local_1a0,uVar31);
    }
    if (-1 < local_1a0->m_capacity) {
      local_1a0->m_count = 0;
    }
    local_e0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008189b0;
    local_e0.m_a = (bool *)0x0;
    local_e0.m_count = 0;
    local_e0.m_capacity = 0;
    if (uVar31 != 0) {
      ON_SimpleArray<bool>::SetCapacity(&local_e0,uVar31);
    }
    local_160 = &mesh->m_F;
    if ((ulong)(long)(mesh->m_F).m_capacity < (ulong)uVar26) {
      ON_SimpleArray<ON_MeshFace>::SetCapacity(local_160,(ulong)uVar26);
    }
    if (-1 < (mesh->m_F).m_capacity) {
      (mesh->m_F).m_count = 0;
    }
    uVar31 = (ulong)uVar12;
    local_100._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00823e40;
    local_100.m_a = (ON_2udex *)0x0;
    local_100.m_count = 0;
    local_100.m_capacity = 0;
    if (uVar12 != 0) {
      ON_SimpleArray<ON_2udex>::SetCapacity(&local_100,uVar31);
    }
    pOVar14 = ON_SubDLevelComponentIdIterator::FirstVertex(vit_by_id);
    while (((pOVar14 != (ON_SubDVertex *)0x0 &&
            (uVar12 = (pOVar14->super_ON_SubDComponentBase).m_archive_id, uVar12 - 1 < uVar23)) &&
           (local_1a0->m_count + 1U == uVar12))) {
      pOVar15 = ON_SimpleArray<ON_3dPoint>::AppendNew(local_1a0);
      ON_3dPoint::operator=(pOVar15,pOVar14->m_P);
      bVar10 = VertexToDuplicate::NeedsDuplicated(pOVar14);
      pbVar16 = ON_SimpleArray<bool>::AppendNew(&local_e0);
      *pbVar16 = bVar10;
      pOVar14 = ON_SubDLevelComponentIdIterator::NextVertex(vit_by_id);
    }
    bVar10 = true;
    if (local_1a0->m_count == uVar23) {
      if ((ulong)(long)local_100.m_capacity < uVar31) {
        ON_SimpleArray<ON_2udex>::SetCapacity(&local_100,uVar31);
      }
      pOVar17 = ON_SubDLevelComponentIdIterator::FirstFace(local_148);
      while (uVar8 = local_128.m_face._4_4_, uVar6 = local_128.m_face._0_4_,
            pOVar17 != (ON_SubDFace *)0x0) {
        local_198.m_vertex = (ON_SubDVertex *)0x0;
        local_198.m_face._0_4_ = 0;
        local_198.m_face._4_4_ = 0;
        local_128.m_face._0_4_ = SUB84(pOVar17,0);
        uVar7 = local_128.m_face._0_4_;
        local_128.m_face._4_4_ = (undefined4)((ulong)pOVar17 >> 0x20);
        uVar9 = local_128.m_face._4_4_;
        local_128.m_face._0_4_ = uVar6;
        local_128.m_face._4_4_ = uVar8;
        if (pOVar17->m_edge_count < 5) {
          if (2 < pOVar17->m_edge_count) {
            if (pOVar17->m_edge_count != 0) {
              uVar31 = 0;
              do {
                pOVar14 = ON_SubDFace::Vertex(pOVar17,(uint)uVar31);
                if (pOVar14 == (ON_SubDVertex *)0x0) {
                  uVar12 = 0;
                }
                else {
                  uVar12 = (pOVar14->super_ON_SubDComponentBase).m_archive_id;
                }
                *(uint *)((long)&local_198.m_vertex + uVar31 * 4) = uVar12;
                if (((int)uVar12 < 1) || ((int)uVar23 < (int)uVar12)) {
                  local_198.m_vertex =
                       (ON_SubDVertex *)CONCAT44(local_198.m_vertex._4_4_,0xffffffff);
                  break;
                }
                *(uint *)((long)&local_198.m_vertex + uVar31 * 4) = uVar12 - 1;
                if (local_e0.m_a[(long)(int)uVar12 + -1] == true) {
                  local_128.m_mesh_F_index = (mesh->m_F).m_count;
                  local_128.m_mesh_V_index = uVar12 - 1;
                  local_128.m_vertex = pOVar14;
                  local_128.m_face._0_4_ = uVar7;
                  local_128.m_face._4_4_ = uVar9;
                  ON_SimpleArray<VertexToDuplicate>::Append(&local_140,&local_128);
                }
                uVar31 = uVar31 + 1;
              } while (uVar31 < pOVar17->m_edge_count);
            }
            if ((int)local_198.m_vertex != -1) {
              if (pOVar17->m_edge_count == 3) {
                local_198.m_face._4_4_ = (int)local_198.m_face;
              }
              ON_SimpleArray<ON_MeshFace>::Append(local_160,(ON_MeshFace *)&local_198);
            }
          }
        }
        else {
          subdivision_point = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&local_98);
          bVar10 = ON_SubDFace::GetSubdivisionPoint(pOVar17,subdivision_point);
          if (bVar10) {
            ON_2udex::ON_2udex((ON_2udex *)&local_c8,(mesh->m_F).m_count,0);
            iVar5 = local_140.m_count;
            iVar33 = local_1a0->m_count;
            iVar2 = (mesh->m_F).m_count;
            local_198.m_face._0_4_ = iVar33;
            local_198.m_face._4_4_ = iVar33;
            pOVar14 = ON_SubDFace::Vertex(pOVar17,0);
            if (pOVar14 == (ON_SubDVertex *)0x0) {
              uVar12 = 0;
            }
            else {
              uVar12 = (pOVar14->super_ON_SubDComponentBase).m_archive_id;
            }
            local_198.m_vertex = (ON_SubDVertex *)CONCAT44(uVar12,(int)local_198.m_vertex);
            if ((int)uVar12 <= (int)uVar23 && 0 < (int)uVar12) {
              local_198.m_vertex = (ON_SubDVertex *)CONCAT44(uVar12 - 1,(int)local_198.m_vertex);
              if (local_e0.m_a[(long)(int)uVar12 + -1] == true) {
                local_128.m_mesh_F_index = (mesh->m_F).m_count;
                local_128.m_mesh_V_index = uVar12 - 1;
                local_128.m_vertex = pOVar14;
                local_128.m_face._0_4_ = uVar7;
                local_128.m_face._4_4_ = uVar9;
                ON_SimpleArray<VertexToDuplicate>::Append(&local_140,&local_128);
              }
              local_1a1 = false;
              ON_SimpleArray<bool>::Append(&local_e0,&local_1a1);
              ON_SimpleArray<ON_3dPoint>::Append(local_1a0,(ON_3dPoint *)&local_98);
              uVar21 = pOVar17->m_edge_count;
              if (uVar21 != 0) {
                uVar30 = 1;
                do {
                  local_198.m_vertex =
                       (ON_SubDVertex *)CONCAT44(local_198.m_vertex._4_4_,local_198.m_vertex._4_4_);
                  pOVar14 = ON_SubDFace::Vertex(pOVar17,(uint)uVar30 % (uint)uVar21);
                  if (pOVar14 == (ON_SubDVertex *)0x0) {
                    uVar12 = 0;
                  }
                  else {
                    uVar12 = (pOVar14->super_ON_SubDComponentBase).m_archive_id;
                  }
                  if (((int)uVar12 < 1) || ((int)uVar23 < (int)uVar12)) {
                    local_198.m_vertex = (ON_SubDVertex *)CONCAT44(uVar12,0xffffffff);
                    break;
                  }
                  uVar26 = (uint)((long)(int)uVar12 + -1);
                  local_198.m_vertex = (ON_SubDVertex *)CONCAT44(uVar26,(int)local_198.m_vertex);
                  if ((uVar30 < pOVar17->m_edge_count) &&
                     (local_e0.m_a[(long)(int)uVar12 + -1] == true)) {
                    local_128.m_mesh_F_index = (mesh->m_F).m_count;
                    local_128.m_mesh_V_index = uVar26;
                    local_128.m_vertex = pOVar14;
                    local_128.m_face._0_4_ = uVar7;
                    local_128.m_face._4_4_ = uVar9;
                    ON_SimpleArray<VertexToDuplicate>::Append(&local_140,&local_128);
                  }
                  ON_SimpleArray<ON_MeshFace>::Append(local_160,(ON_MeshFace *)&local_198);
                  uVar30 = uVar30 + 1;
                  uVar21 = pOVar17->m_edge_count;
                } while (uVar30 <= uVar21);
              }
              local_c8.x._4_4_ = (mesh->m_F).m_count;
              if ((int)local_198.m_vertex != -1) {
                uVar26 = local_c8.x._4_4_ - local_c8.x._0_4_;
                uVar12 = ON_SubDFace::EdgeCount(pOVar17);
                if (uVar26 == uVar12) {
                  local_c8.x._4_4_ = (mesh->m_F).m_count;
                  if (2 < uVar26) {
                    ON_SimpleArray<ON_2udex>::Append(&local_100,(ON_2udex *)&local_c8);
                  }
                  goto LAB_0063332d;
                }
              }
              if ((-1 < iVar33) && (iVar33 <= local_1a0->m_capacity)) {
                local_1a0->m_count = iVar33;
              }
              if ((-1 < iVar2) && (iVar2 <= (mesh->m_F).m_capacity)) {
                (mesh->m_F).m_count = iVar2;
              }
              if ((-1 < iVar5) && (iVar5 <= local_140.m_capacity)) {
                local_140._16_8_ = CONCAT44(local_140.m_capacity,iVar5);
              }
            }
          }
        }
LAB_0063332d:
        pOVar17 = ON_SubDLevelComponentIdIterator::NextFace(local_148);
      }
      bVar10 = (mesh->m_F).m_count == 0;
    }
    ON_SubDLevel::ClearArchiveId(local_168);
    if (((bVar10) || (uVar23 = local_1a0->m_count, uVar23 < 3)) || ((mesh->m_F).m_count == 0)) {
      ON_SubDIncrementErrorCount();
      bVar10 = false;
    }
    else {
      uVar31 = local_140._16_8_ & 0xffffffff;
      if (1 < uVar31) {
        local_148 = (ON_SubDLevelComponentIdIterator *)CONCAT44(local_148._4_4_,(mesh->m_F).m_count)
        ;
        ON_SimpleArray<VertexToDuplicate>::QuickSortAndRemoveDuplicates
                  (&local_140,VertexToDuplicate::CompareVertexIdAndFaceId);
        local_98.m_current_fei[0] = 0;
        local_98.m_current_fei[1] = 0;
        local_98.m_initial_face_dir = 0;
        local_98.m_current_face_dir = 0;
        local_98.m_current_eptr[1].m_ptr = 0;
        local_98.m_initial_fvi = 0;
        local_98.m_current_fvi = 0;
        local_98.m_current_face = (ON_SubDFace *)0x0;
        local_98.m_current_eptr[0].m_ptr = 0;
        local_98.m_center_vertex = (ON_SubDVertex *)0x0;
        local_98.m_initial_face = (ON_SubDFace *)0x0;
        local_98.m_current_ring_index = 0;
        local_168 = (ON_SubDLevel *)0x0;
        pVVar29 = local_140.m_a;
        if (local_140.m_count < 1) {
          pVVar29 = (VertexToDuplicate *)0x0;
        }
        local_50 = &pVVar29->m_sector_id;
        local_48 = &pVVar29->m_mesh_F_index;
        uVar28 = 0;
        local_e4 = uVar23;
        local_40 = pVVar29;
        local_38 = uVar31;
LAB_0063356b:
        uVar18 = uVar28 & 0xffffffff;
        local_158 = uVar18 * 0x20;
        local_198.m_vertex = pVVar29[uVar18].m_vertex;
        local_198.m_face._0_4_ = *(int *)&pVVar29[uVar18].m_face;
        puVar1 = (undefined8 *)((long)&pVVar29[uVar18].m_face + 4);
        uVar3 = *puVar1;
        local_198._20_8_ = puVar1[1];
        local_198.m_face._4_4_ = (int)uVar3;
        local_198.m_sector_id = (uint)((ulong)uVar3 >> 0x20);
        if (local_198.m_vertex != (ON_SubDVertex *)0x0) {
          uVar23 = (int)uVar28 + 1;
          uVar28 = (ulong)uVar23;
          local_a8 = uVar18;
          if (uVar23 < (uint)uVar31) {
            uVar28 = (ulong)uVar23;
            pVVar32 = pVVar29 + uVar28;
            do {
              if (pVVar32 == &local_198) {
                uVar12 = 0;
              }
              else {
                uVar13 = 0;
                uVar26 = 0;
                if (local_198.m_vertex != (ON_SubDVertex *)0x0) {
                  uVar26 = ((local_198.m_vertex)->super_ON_SubDComponentBase).m_id;
                }
                if (pVVar32->m_vertex != (ON_SubDVertex *)0x0) {
                  uVar13 = (pVVar32->m_vertex->super_ON_SubDComponentBase).m_id;
                }
                uVar12 = (uint)(uVar13 < uVar26);
                if (uVar26 < uVar13) {
                  uVar12 = 0xffffffff;
                }
              }
              if ((int)uVar12 < 0) {
                iVar33 = 5;
              }
              else if (((uVar12 != 0) || (local_198.m_vertex != pVVar32->m_vertex)) ||
                      ((local_e4 <= local_198.m_mesh_V_index ||
                       (iVar33 = 0, local_198.m_mesh_V_index != pVVar32->m_mesh_V_index)))) {
                iVar33 = 1;
                ON_SubDIncrementErrorCount();
              }
              if (iVar33 != 0) {
                if (iVar33 != 5) goto LAB_006333c4;
                goto LAB_0063365e;
              }
              uVar28 = uVar28 + 1;
              pVVar32 = pVVar32 + 1;
            } while (uVar31 != uVar28);
            uVar28 = uVar31 & 0xffffffff;
          }
LAB_0063365e:
          local_a0 = uVar28;
          if ((uint)uVar28 != uVar23) {
            __base = (void *)((long)&pVVar29->m_vertex + local_158);
            local_160 = (ON_SimpleArray<ON_MeshFace> *)(local_198._20_8_ & 0xffffffff);
            local_c8.z = local_1a0->m_a[(long)local_160].z;
            pOVar15 = local_1a0->m_a + (long)local_160;
            local_c8.x._0_4_ = *(int *)&pOVar15->x;
            local_c8.x._4_4_ = *(int *)((long)&pOVar15->x + 4);
            local_c8.y._0_4_ = *(undefined4 *)&pOVar15->y;
            local_c8.y._4_4_ = *(undefined4 *)((long)&pOVar15->y + 4);
            local_16c = (uint)uVar28 - (int)local_a8;
            if (local_16c == 0) {
LAB_006338b7:
              iVar33 = 0;
            }
            else {
              uVar28 = (ulong)local_16c;
              uVar31 = 0;
              iVar33 = 0;
              do {
                if (*(int *)((long)__base + uVar31 * 0x20 + 0x10) == 0) {
                  pOVar14 = ON_SubDSectorIterator::Initialize
                                      (&local_98,*(ON_SubDFace **)((long)__base + uVar31 * 0x20 + 8)
                                       ,0,local_198.m_vertex);
                  local_168 = (ON_SubDLevel *)(ulong)((int)local_168 + 1);
                  if ((pOVar14 != (ON_SubDVertex *)0x0) &&
                     (pOVar17 = ON_SubDSectorIterator::IncrementToCrease(&local_98,-1),
                     pOVar17 != (ON_SubDFace *)0x0)) {
                    iVar33 = iVar33 + 1;
                    if ((uVar31 != 0) ||
                       (bVar10 = ON_SubDVertex::IsDart(local_198.m_vertex), !bVar10)) {
                      pOVar17 = ON_SubDSectorIterator::CurrentFace(&local_98);
                      local_198.m_face._0_4_ = (int)pOVar17;
                      local_198.m_face._4_4_ = (int)((ulong)pOVar17 >> 0x20);
                      while (pOVar17 != (ON_SubDFace *)0x0) {
                        pvVar19 = bsearch(&local_198,__base,uVar28,0x20,
                                          VertexToDuplicate::CompareVertexIdAndFaceId);
                        if (pvVar19 == (void *)0x0) {
                          iVar33 = 0;
                          ON_SubDIncrementErrorCount();
                          break;
                        }
                        *(int *)((long)pvVar19 + 0x10) = (int)local_168;
                        pOVar17 = ON_SubDSectorIterator::NextFace(&local_98,AnyCrease);
                        local_198.m_face._0_4_ = (int)pOVar17;
                        local_198.m_face._4_4_ = (int)((ulong)pOVar17 >> 0x20);
                      }
                      if (iVar33 != 0) goto LAB_006337bc;
                      goto LAB_006338b7;
                    }
                    this_00 = ON_SubDSectorIterator::CurrentEdge(&local_98,0);
                    if (((this_00 != (ON_SubDEdge *)0x0) &&
                        (bVar10 = ON_SubDEdge::IsCrease(this_00), bVar10)) &&
                       (this_00->m_face_count == 2)) {
                      uVar23 = 0;
                      goto LAB_00633809;
                    }
                  }
                  ON_SubDIncrementErrorCount();
                  goto LAB_006338b7;
                }
LAB_006337bc:
                uVar31 = uVar31 + 1;
              } while (uVar31 != uVar28);
            }
            goto LAB_006338ba;
          }
          goto LAB_006339cf;
        }
        ON_SubDIncrementErrorCount();
      }
LAB_006333c4:
      bVar10 = true;
      if ((local_100.m_count != 0) && (2 < (uint)local_150)) {
        local_98.m_center_vertex = (ON_SubDVertex *)&PTR__ON_SimpleArray_0081c860;
        local_98.m_initial_face = (ON_SubDFace *)0x0;
        local_98.m_current_face = (ON_SubDFace *)0x0;
        uVar23 = (uint)local_150 * 2;
        if (uVar23 != 0) {
          ON_SimpleArray<unsigned_int>::SetCapacity
                    ((ON_SimpleArray<unsigned_int> *)&local_98,(ulong)uVar23);
        }
        pOVar17 = local_98.m_initial_face;
        if (local_100.m_count != 0) {
          uVar31 = local_150 & 0xffffffff;
          pOVar4 = &(local_98.m_initial_face)->super_ON_SubDComponentBase;
          uVar28 = 0;
          do {
            uVar23 = local_100.m_a[uVar28].i;
            uVar18 = (ulong)uVar23;
            uVar12 = local_100.m_a[uVar28].j;
            if (2 < uVar12 - uVar23) {
              *(uint *)&(pOVar17->super_ON_SubDComponentBase).m_subd_point1 = uVar23;
              pOVar27 = (mesh->m_F).m_a;
              *(int *)&(pOVar17->super_ON_SubDComponentBase).m_subd_point1 = pOVar27[uVar18].vi[0];
              uVar26 = 0;
              if (uVar23 < uVar12) {
                pOVar27 = pOVar27 + uVar18;
                pOVar22 = pOVar17;
                do {
                  *(uint *)&(pOVar22->super_ON_SubDComponentBase).m_subd_point1 = (uint)uVar18;
                  *(int *)((long)(pOVar22->super_ON_SubDComponentBase).m_saved_subd_point1 +
                          uVar31 * 4 + -0x18) = pOVar27->vi[0];
                  pOVar22 = (ON_SubDFace *)
                            ((long)&(pOVar22->super_ON_SubDComponentBase).m_subd_point1 + 4);
                  uVar13 = (uint)uVar18 + 1;
                  uVar18 = (ulong)uVar13;
                  pOVar27 = pOVar27 + 1;
                  uVar26 = uVar12 - uVar23;
                } while (uVar12 != uVar13);
              }
              ON_Mesh::AddNgon(mesh,uVar26,
                               (uint *)((long)pOVar4->m_saved_subd_point1 + uVar31 * 4 + -0x18),
                               uVar26,(uint *)pOVar17);
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 < (local_100._16_8_ & 0xffffffff));
        }
        ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)&local_98);
      }
    }
    ON_SimpleArray<ON_2udex>::~ON_SimpleArray(&local_100);
    ON_SimpleArray<bool>::~ON_SimpleArray(&local_e0);
  }
  ON_SimpleArray<VertexToDuplicate>::~ON_SimpleArray(&local_140);
  return bVar10;
  while ((uVar23 == 0 && (uVar23 = 1, bVar10))) {
LAB_00633809:
    pOVar17 = ON_SubDEdge::Face(this_00,uVar23);
    local_198.m_face._0_4_ = (int)pOVar17;
    local_198.m_face._4_4_ = (int)((ulong)pOVar17 >> 0x20);
    pvVar19 = bsearch(&local_198,__base,uVar28,0x20,VertexToDuplicate::CompareVertexIdAndFaceId);
    if (pvVar19 == (void *)0x0) {
LAB_00633876:
      iVar33 = 0;
      ON_SubDIncrementErrorCount();
      bVar10 = false;
    }
    else {
      *(int *)((long)pvVar19 + 0x14) = local_1a0->m_count;
      ON_SimpleArray<ON_3dPoint>::Append(local_1a0,&local_c8);
      bVar11 = Internal_UpdateMeshFaceVertexIndex
                         (mesh,*(uint *)((long)pvVar19 + 0x18),(uint)local_148,(uint)local_160,
                          *(uint *)((long)pvVar19 + 0x14));
      bVar10 = true;
      if (!bVar11) goto LAB_00633876;
    }
  }
  puVar20 = (undefined4 *)((long)local_50 + local_158);
  do {
    *puVar20 = (int)local_168;
    puVar20 = puVar20 + 8;
    uVar28 = uVar28 - 1;
  } while (uVar28 != 0);
LAB_006338ba:
  uVar31 = local_38;
  pVVar29 = local_40;
  if (iVar33 != 0) {
    if (iVar33 != 1) {
      ON_qsort(__base,(ulong)local_16c,0x20,VertexToDuplicate::CompareSectorIdAndFaceId);
    }
    uVar31 = local_38;
    pVVar29 = local_40;
    if ((int)local_a0 != (int)local_a8) {
      local_158 = local_158 + (long)local_48;
      uVar28 = 0;
      do {
        lVar24 = uVar28 * 0x20;
        local_198.m_vertex = *(ON_SubDVertex **)((long)__base + lVar24);
        lVar34 = ((long *)((long)__base + lVar24))[1];
        puVar1 = (undefined8 *)((long)__base + lVar24 + 0xc);
        local_198._20_8_ = puVar1[1];
        local_198.m_sector_id = (uint)((ulong)*puVar1 >> 0x20);
        uVar23 = (uint)uVar28;
        uVar12 = uVar23 + 1;
        if (uVar23 + 1 < local_16c) {
          uVar12 = local_16c;
        }
        local_198.m_face._0_4_ = (int)lVar34;
        local_198.m_face._4_4_ = (int)((ulong)lVar34 >> 0x20);
        uVar18 = uVar28;
        do {
          if (uVar12 - 1 == (int)uVar18) {
            uVar18 = (ulong)uVar12;
            break;
          }
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (local_198.m_sector_id == *(uint *)((long)__base + uVar18 * 0x20 + 0x10));
        if (uVar23 != 0) {
          local_198.m_mesh_F_index = (uint)((ulong)local_198._20_8_ >> 0x20);
          local_198.m_mesh_V_index = local_1a0->m_count;
          ON_SimpleArray<ON_3dPoint>::Append(local_1a0,&local_c8);
          if (uVar23 < (uint)uVar18) {
            lVar34 = uVar18 - uVar28;
            puVar25 = (uint *)(lVar24 + local_158);
            do {
              Internal_UpdateMeshFaceVertexIndex
                        (mesh,*puVar25,(uint)local_148,(uint)local_160,local_198.m_mesh_V_index);
              puVar25 = puVar25 + 8;
              lVar34 = lVar34 + -1;
            } while (lVar34 != 0);
          }
        }
        uVar31 = local_38;
        pVVar29 = local_40;
        uVar28 = uVar18;
      } while ((uint)uVar18 < local_16c);
    }
  }
LAB_006339cf:
  uVar28 = local_a0;
  if ((uint)uVar31 <= (uint)local_a0) goto LAB_006333c4;
  goto LAB_0063356b;
}

Assistant:

bool ON_SubD::Internal_GetGeometryControlNetMesh(
  const ON_SubDLevel& level,
  ON_SubDLevelComponentIdIterator& vit_by_id,
  ON_SubDLevelComponentIdIterator& fit_by_id,
  ON_Mesh& mesh
) const
{
  VertexToDuplicate dup;
  ON_SimpleArray<VertexToDuplicate> dups_array;

  const unsigned int subd_vertex_count = level.m_vertex_count;

  unsigned int mesh_ngon_count = 0;
  unsigned int mesh_face_count = 0;
  unsigned int max_ngon_Vcount = 0;
  for (const ON_SubDFace* face = level.m_face[0]; nullptr != face; face = face->m_next_face)
  {
    if ( face->m_edge_count < 2 )
      continue;
    if (face->m_edge_count <= 4)
    {
      mesh_face_count++;
      continue;
    }
    mesh_ngon_count++;
    mesh_face_count += face->m_edge_count;
    if ( max_ngon_Vcount < face->m_edge_count )
      max_ngon_Vcount = face->m_edge_count;
  }

  if (subd_vertex_count < 3 || mesh_face_count < 1 )
    return ON_SUBD_RETURN_ERROR(false);

  const size_t D_initial_capacity = subd_vertex_count + mesh_ngon_count;
  ON_3dPointArray& D = mesh.DoublePrecisionVertices();
  D.Reserve(D_initial_capacity);
  D.SetCount(0);
  ON_SimpleArray<bool> mesh_VertexNeedsDuplicated(D_initial_capacity);

  mesh.m_F.Reserve(mesh_face_count);
  mesh.m_F.SetCount(0);

  ON_SimpleArray< ON_2udex > ngon_spans(mesh_ngon_count);

  bool rc = false;
  for (;;)
  {
    // must iterate vertices in order of increasing id
    for (const ON_SubDVertex* vertex = vit_by_id.FirstVertex(); nullptr != vertex; vertex = vit_by_id.NextVertex())
    {
      unsigned int vi = vertex->ArchiveId();
      if (vi < 1 || vi > subd_vertex_count)
        break;
      if (D.UnsignedCount()+1 != vi)
        break;
      D.AppendNew() = vertex->m_P;
      mesh_VertexNeedsDuplicated.AppendNew() = VertexToDuplicate::NeedsDuplicated(vertex);
    }

    if (D.UnsignedCount() != subd_vertex_count)
      break;

    ngon_spans.Reserve(mesh_ngon_count);
    unsigned int max_ngon_face_count = 0;
    mesh_face_count = 0;
    // must iterate faces in order of increasing id
    for (const ON_SubDFace* face = fit_by_id.FirstFace(); nullptr != face; face = fit_by_id.NextFace())
    {
      ON_MeshFace meshf = {};
      
      if (face->m_edge_count <= 4)
      {
        // SubD quad face or 3-gon face gets a single ON_Mesh face
        if (face->m_edge_count < 3)
          continue;

        //const bool bQuad = 4 == face->m_edge_count;

        for (unsigned short fvi = 0; fvi < face->m_edge_count; fvi++)
        {
          const ON_SubDVertex* vertex = face->Vertex(fvi);
          meshf.vi[fvi] = (int)((nullptr != vertex) ? vertex->ArchiveId() : 0U);
          if (meshf.vi[fvi] < 1 || meshf.vi[fvi] > (int)subd_vertex_count)
          {
            meshf.vi[0] = -1;
            break;
          }
          meshf.vi[fvi]--;
          if (mesh_VertexNeedsDuplicated[meshf.vi[fvi]])
          {
            dup.m_vertex = vertex;
            dup.m_face = face;
            dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
            dup.m_mesh_V_index = meshf.vi[fvi];
            dups_array.Append(dup);
          }
        }
        if (-1 == meshf.vi[0] )
          continue;
        if ( 3 == face->m_edge_count)
          meshf.vi[3] = meshf.vi[2];
        mesh.m_F.Append(meshf);
        continue;
      }
      else // face->m_edge_count >= 5
      {
        // SubD n-gon face with n >= 5 gets n ON_Mesh triangles grouped into
        ON_3dPoint center_point;
        if (false == face->GetSubdivisionPoint( center_point))
          continue;

        ON_2udex ngon_span = { mesh.m_F.UnsignedCount(), 0 };

        const unsigned int dup_count0 = dups_array.UnsignedCount();

        const unsigned int Dcount0 = D.UnsignedCount();
        const unsigned int Fcount0 = mesh.m_F.UnsignedCount();
        meshf.vi[2] = (int)Dcount0;
        meshf.vi[3] = meshf.vi[2];

        const ON_SubDVertex* vertex = face->Vertex(0);
        meshf.vi[1] = (nullptr != vertex) ? vertex->ArchiveId() : 0;
        if (meshf.vi[1] < 1 || meshf.vi[1] > (int)subd_vertex_count)
          continue;
        meshf.vi[1]--;

        if (mesh_VertexNeedsDuplicated[meshf.vi[1]])
        {
          dup.m_vertex = vertex;
          dup.m_face = face;
          dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
          dup.m_mesh_V_index = meshf.vi[1];
          dups_array.Append(dup);
        }

        mesh_VertexNeedsDuplicated.Append(false);
        D.Append(center_point);

        for (unsigned short fvi = 1; fvi <= face->m_edge_count; fvi++)
        {
          meshf.vi[0] = meshf.vi[1];
          vertex = face->Vertex(fvi % face->m_edge_count);
          meshf.vi[1] = (int)((nullptr != vertex) ? vertex->ArchiveId() : 0U);
          if (meshf.vi[1] < 1 || meshf.vi[1] > (int)subd_vertex_count)
          {
            meshf.vi[0] = -1;
            break;
          }
          meshf.vi[1]--;

          if (fvi < face->m_edge_count)
          {
            if (mesh_VertexNeedsDuplicated[meshf.vi[1]])
            {
              dup.m_vertex = vertex;
              dup.m_face = face;
              dup.m_mesh_F_index = mesh.m_F.UnsignedCount();
              dup.m_mesh_V_index = meshf.vi[1];
              dups_array.Append(dup);
            }
          }

          mesh.m_F.Append(meshf);
        }
        ngon_span.j = mesh.m_F.UnsignedCount();

        unsigned int ngon_face_count = ngon_span.j - ngon_span.i;
        if ( -1 == meshf.vi[0] || ngon_face_count != face->EdgeCount() )
        {
          D.SetCount(Dcount0);
          mesh.m_F.SetCount(Fcount0);
          dups_array.SetCount(dup_count0);
          continue;
        }
        ngon_span.j = mesh.m_F.UnsignedCount();
        if (ngon_face_count >= 3)
        {
          ngon_spans.Append(ngon_span);
          if ( ngon_face_count > max_ngon_face_count)
            max_ngon_face_count = ngon_face_count;
        }
      }
    }

    if (mesh.m_F.UnsignedCount() <= 0)
      break;

    rc = true;
    break;
  }

  level.ClearArchiveId();
  if (false == rc )
    return ON_SUBD_RETURN_ERROR(false);

  if (D.UnsignedCount() < 3 || mesh.m_F.UnsignedCount() < 1)
    return ON_SUBD_RETURN_ERROR(false);

  Internal_DuplicateVertices( mesh, D, dups_array);

  // group all mesh faces that came from the same level zero subd face into an ngon.
  if (ngon_spans.UnsignedCount() > 0 && max_ngon_Vcount >= 3)
  {
    ON_SimpleArray< unsigned int> ngon_buffer;
    unsigned int* ngon_fi = ngon_buffer.Reserve(2*max_ngon_Vcount);
    unsigned int* ngon_vi = ngon_fi + max_ngon_Vcount;
    for (unsigned int ngon_dex = 0; ngon_dex < ngon_spans.UnsignedCount(); ngon_dex++ )
    {
      ON_2udex ngon_span = ngon_spans[ngon_dex];
      unsigned int Fcount = ngon_span.j-ngon_span.i;
      if ( Fcount < 3)
        continue;

      ngon_fi[0] = ngon_span.i;
      ngon_fi[0] = (unsigned int)mesh.m_F[ngon_fi[0]].vi[0];

      unsigned int ngon_Vcount = 0;
      for (unsigned int i = ngon_span.i; i < ngon_span.j; i++)
      {
        ngon_fi[ngon_Vcount] = i;
        ngon_vi[ngon_Vcount] = (unsigned int)(mesh.m_F[i].vi[0]);
        ngon_Vcount++;
      }
      mesh.AddNgon(ngon_Vcount, ngon_vi, ngon_Vcount, ngon_fi );
    }
  }

  return true;
}